

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

string * __thiscall
vkt::image::(anonymous_namespace)::getAtomicOperationShaderFuncName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AtomicOperation op)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "imageAtomicAdd";
    __a = &local_9;
    break;
  case 1:
    __s = "imageAtomicMin";
    __a = &local_a;
    break;
  case 2:
    __s = "imageAtomicMax";
    __a = &local_b;
    break;
  case 3:
    __s = "imageAtomicAnd";
    __a = &local_c;
    break;
  case 4:
    __s = "imageAtomicOr";
    __a = &local_d;
    break;
  case 5:
    __s = "imageAtomicXor";
    __a = &local_e;
    break;
  case 6:
    __s = "imageAtomicExchange";
    __a = &local_f;
    break;
  default:
    __a = &local_10;
    __s = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static string getAtomicOperationShaderFuncName (const AtomicOperation op)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:			return string("imageAtomicAdd");
		case ATOMIC_OPERATION_MIN:			return string("imageAtomicMin");
		case ATOMIC_OPERATION_MAX:			return string("imageAtomicMax");
		case ATOMIC_OPERATION_AND:			return string("imageAtomicAnd");
		case ATOMIC_OPERATION_OR:			return string("imageAtomicOr");
		case ATOMIC_OPERATION_XOR:			return string("imageAtomicXor");
		case ATOMIC_OPERATION_EXCHANGE:		return string("imageAtomicExchange");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}